

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O1

int ecjpake_hash(mbedtls_md_type_t md_type,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *G,
                mbedtls_ecp_point *V,mbedtls_ecp_point *X,char *id,mbedtls_mpi *h)

{
  uint *end;
  byte bVar1;
  int iVar2;
  size_t __n;
  mbedtls_md_info_t *pmVar3;
  uint uVar4;
  size_t ilen;
  uint *__dest;
  uint local_158 [2];
  uchar buf [217];
  uchar hash [32];
  uint *local_38;
  uchar *p;
  
  local_38 = local_158;
  end = (uint *)(buf + 0xd1);
  __n = strlen(id);
  iVar2 = ecjpake_write_len_point((uchar **)&local_38,(uchar *)end,grp,pf,G);
  if (iVar2 == 0) {
    iVar2 = ecjpake_write_len_point((uchar **)&local_38,(uchar *)end,grp,pf,V);
    if (iVar2 == 0) {
      iVar2 = ecjpake_write_len_point((uchar **)&local_38,(uchar *)end,grp,pf,X);
      if (iVar2 == 0) {
        iVar2 = -0x4f00;
        if (3 < (long)end - (long)local_38) {
          uVar4 = (uint)__n;
          *local_38 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                      uVar4 << 0x18;
          __dest = local_38 + 1;
          if (__n <= (ulong)((long)end - (long)__dest) && __dest <= end) {
            local_38 = __dest;
            memcpy(__dest,id,__n);
            local_38 = (uint *)(__n + (long)__dest);
            ilen = (long)local_38 - (long)local_158;
            pmVar3 = mbedtls_md_info_from_type(md_type);
            iVar2 = mbedtls_md(pmVar3,(uchar *)local_158,ilen,buf + 0xd8);
            if (iVar2 == 0) {
              pmVar3 = mbedtls_md_info_from_type(md_type);
              bVar1 = mbedtls_md_get_size(pmVar3);
              iVar2 = mbedtls_mpi_read_binary(h,buf + 0xd8,(ulong)bVar1);
              if (iVar2 == 0) {
                iVar2 = mbedtls_mpi_mod_mpi(h,h,&grp->N);
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int ecjpake_hash(const mbedtls_md_type_t md_type,
                        const mbedtls_ecp_group *grp,
                        const int pf,
                        const mbedtls_ecp_point *G,
                        const mbedtls_ecp_point *V,
                        const mbedtls_ecp_point *X,
                        const char *id,
                        mbedtls_mpi *h)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char buf[ECJPAKE_HASH_BUF_LEN];
    unsigned char *p = buf;
    const unsigned char *end = buf + sizeof(buf);
    const size_t id_len = strlen(id);
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];

    /* Write things to temporary buffer */
    MBEDTLS_MPI_CHK(ecjpake_write_len_point(&p, end, grp, pf, G));
    MBEDTLS_MPI_CHK(ecjpake_write_len_point(&p, end, grp, pf, V));
    MBEDTLS_MPI_CHK(ecjpake_write_len_point(&p, end, grp, pf, X));

    if (end - p < 4) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    MBEDTLS_PUT_UINT32_BE(id_len, p, 0);
    p += 4;

    if (end < p || (size_t) (end - p) < id_len) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    memcpy(p, id, id_len);
    p += id_len;

    /* Compute hash */
    MBEDTLS_MPI_CHK(mbedtls_ecjpake_compute_hash(md_type,
                                                 buf, p - buf, hash));

    /* Turn it into an integer mod n */
    MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(h, hash,
                                            mbedtls_md_get_size_from_type(md_type)));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(h, h, &grp->N));

cleanup:
    return ret;
}